

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

vector<field::GF2E,_std::allocator<field::GF2E>_> *
operator*(vector<field::GF2E,_std::allocator<field::GF2E>_> *lhs,
         vector<field::GF2E,_std::allocator<field::GF2E>_> *rhs)

{
  size_type sVar1;
  reference this;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDX;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  size_t j;
  size_t i;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *result;
  GF2E *in_stack_ffffffffffffff68;
  allocator_type *in_stack_ffffffffffffff80;
  ulong uVar2;
  size_type in_stack_ffffffffffffff88;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *this_00;
  GF2E local_48;
  ulong local_40;
  ulong local_38;
  undefined1 local_19;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *local_18;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *local_10;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RSI);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(local_18);
  std::allocator<field::GF2E>::allocator((allocator<field::GF2E> *)0x12f4d1);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<field::GF2E>::~allocator((allocator<field::GF2E> *)0x12f4f1);
  local_38 = 0;
  while (uVar2 = local_38,
        sVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(local_10),
        uVar2 < sVar1) {
    local_40 = 0;
    while (uVar2 = local_40,
          sVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(local_18),
          uVar2 < sVar1) {
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](local_10,local_38);
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](local_18,local_40);
      local_48 = field::GF2E::operator*(in_stack_ffffffffffffff68,(GF2E *)0x12f589);
      this = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[]
                       (in_RDI,local_38 + local_40);
      field::GF2E::operator+=(this,&local_48);
      local_40 = local_40 + 1;
    }
    local_38 = local_38 + 1;
  }
  return this_00;
}

Assistant:

std::vector<field::GF2E> operator*(const std::vector<field::GF2E> &lhs,
                                   const std::vector<field::GF2E> &rhs) {

  std::vector<field::GF2E> result(lhs.size() + rhs.size() - 1);
  for (size_t i = 0; i < lhs.size(); i++)
    for (size_t j = 0; j < rhs.size(); j++)
      result[i + j] += lhs[i] * rhs[j];

  return result;
}